

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetScrollHereX(float center_x_ratio)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  float fVar3;
  float fVar4;
  
  pIVar2 = GImGui->CurrentWindow;
  fVar1 = (GImGui->Style).ItemSpacing.x;
  fVar4 = (pIVar2->DC).LastItemRect.Min.x - fVar1;
  fVar3 = (pIVar2->WindowPadding).x - fVar1;
  (pIVar2->ScrollTarget).x =
       (float)(int)(((((fVar1 + (pIVar2->DC).LastItemRect.Max.x) - fVar4) * center_x_ratio + fVar4)
                    - (pIVar2->Pos).x) + (pIVar2->Scroll).x);
  (pIVar2->ScrollTargetCenterRatio).x = center_x_ratio;
  (pIVar2->ScrollTargetEdgeSnapDist).x = (float)(~-(uint)(fVar3 <= 0.0) & (uint)fVar3);
  return;
}

Assistant:

void ImGui::SetScrollHereX(float center_x_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_x = g.Style.ItemSpacing.x;
    float target_pos_x = ImLerp(window->DC.LastItemRect.Min.x - spacing_x, window->DC.LastItemRect.Max.x + spacing_x, center_x_ratio);
    SetScrollFromPosX(window, target_pos_x - window->Pos.x, center_x_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.x = ImMax(0.0f, window->WindowPadding.x - spacing_x);
}